

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*,_long>::operator()
          (make_exception<const_char_*,_long> *this,stringstream *msg,char *arg,long args)

{
  make_exception<long> local_29;
  long local_28;
  long args_local;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_long> *this_local;
  
  local_28 = args;
  args_local = (long)arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<long>::operator()(&local_29,(stringstream *)arg_local,local_28);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }